

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestSpec::ExcludedPattern::ExcludedPattern
          (ExcludedPattern *this,Ptr<Catch::TestSpec::Pattern> *underlyingPattern)

{
  Ptr<Catch::TestSpec::Pattern> *in_RDI;
  Pattern *in_stack_ffffffffffffffe0;
  
  Pattern::Pattern(in_stack_ffffffffffffffe0);
  in_RDI->m_p = (Pattern *)&PTR__ExcludedPattern_002c22a0;
  Ptr<Catch::TestSpec::Pattern>::Ptr
            ((Ptr<Catch::TestSpec::Pattern> *)in_stack_ffffffffffffffe0,in_RDI);
  return;
}

Assistant:

ExcludedPattern( Ptr<Pattern> const& underlyingPattern ) : m_underlyingPattern( underlyingPattern ) {}